

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O0

int test_next_on_arrays(void)

{
  int iVar1;
  
  _plan(0x34,true);
  _space(_stdout);
  printf("# *** %s ***\n","test_next_on_arrays");
  test_next_on_array(0);
  test_next_on_array(1);
  test_next_on_array(0xf);
  test_next_on_array(0x10);
  test_next_on_array(0x11);
  test_next_on_array(0xfe);
  test_next_on_array(0xff);
  test_next_on_array(0x100);
  test_next_on_array(0x101);
  test_next_on_array(0xfffe);
  test_next_on_array(0xffff);
  test_next_on_array(0x10000);
  test_next_on_array(0x10001);
  _space(_stdout);
  printf("# *** %s: done ***\n","test_next_on_arrays");
  iVar1 = check_plan();
  return iVar1;
}

Assistant:

static int
test_next_on_arrays(void)
{
	plan(52);
	header();

	test_next_on_array(0x00);
	test_next_on_array(0x01);
	test_next_on_array(0x0f);
	test_next_on_array(0x10);
	test_next_on_array(0x11);
	test_next_on_array(0xfe);
	test_next_on_array(0xff);
	test_next_on_array(0x100);
	test_next_on_array(0x101);
	test_next_on_array(0xfffe);
	test_next_on_array(0xffff);
	test_next_on_array(0x10000);
	test_next_on_array(0x10001);

	footer();
	return check_plan();
}